

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::ParseArguments(CConsole *this,int NumArgs,char **ppArguments)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    iVar1 = str_comp((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(char *)in_RDI);
    if (iVar1 == 0) {
      if (1 < in_ESI - iVar2) {
        (**(code **)(*in_RDI + 0xb0))(in_RDI,*(undefined8 *)(in_RDX + (long)(iVar2 + 1) * 8));
      }
      iVar2 = iVar2 + 1;
    }
    else {
      iVar1 = str_comp((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(char *)in_RDI);
      if ((((iVar1 != 0) &&
           (iVar1 = str_comp((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(char *)in_RDI),
           iVar1 != 0)) &&
          (iVar1 = str_comp((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(char *)in_RDI),
          iVar1 != 0)) &&
         (iVar1 = str_comp((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),(char *)in_RDI),
         iVar1 != 0)) {
        (**(code **)(*in_RDI + 0x98))(in_RDI,*(undefined8 *)(in_RDX + (long)iVar2 * 8));
      }
    }
  }
  return;
}

Assistant:

void CConsole::ParseArguments(int NumArgs, const char **ppArguments)
{
	for(int i = 0; i < NumArgs; i++)
	{
		// check for scripts to execute
		if(str_comp("-f", ppArguments[i]) == 0)
		{
			if(NumArgs - i > 1)
				ExecuteFile(ppArguments[i+1]);
			i++;
		}
		else if(!str_comp("-s", ppArguments[i]) || !str_comp("--silent", ppArguments[i]) ||
				!str_comp("-d", ppArguments[i]) || !str_comp("--default", ppArguments[i]))
		{
			// skip silent, default param
			continue;
		}
		else
		{
			// search arguments for overrides
			ExecuteLine(ppArguments[i]);
		}
	}
}